

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gia.h
# Opt level: O2

int Gia_AigerWriteUnsignedBuffer(uchar *pBuffer,int Pos,uint x)

{
  int iVar1;
  long lVar2;
  byte *pbVar3;
  
  lVar2 = (long)Pos << 0x20;
  iVar1 = Pos + 1;
  pbVar3 = pBuffer + Pos;
  for (; 0x7f < x; x = x >> 7) {
    *pbVar3 = (byte)x | 0x80;
    lVar2 = lVar2 + 0x100000000;
    iVar1 = iVar1 + 1;
    pbVar3 = pbVar3 + 1;
  }
  pBuffer[lVar2 >> 0x20] = (byte)x;
  return iVar1;
}

Assistant:

static inline int Gia_AigerWriteUnsignedBuffer( unsigned char * pBuffer, int Pos, unsigned x )
{
    unsigned char ch;
    while (x & ~0x7f)
    {
        ch = (x & 0x7f) | 0x80;
        pBuffer[Pos++] = ch;
        x >>= 7;
    }
    ch = x;
    pBuffer[Pos++] = ch;
    return Pos;
}